

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QModelIndex> * __thiscall
QList<QModelIndex>::operator+=(QList<QModelIndex> *this,QList<QModelIndex> *l)

{
  qsizetype *pqVar1;
  QModelIndex *pQVar2;
  long lVar3;
  Data *pDVar4;
  QModelIndex *pQVar5;
  QModelIndex *pQVar6;
  quintptr qVar7;
  int iVar8;
  QModelIndex *pQVar9;
  
  lVar3 = (l->d).size;
  if (lVar3 != 0) {
    pDVar4 = (l->d).d;
    if ((pDVar4 == (Data *)0x0) ||
       (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pQVar5 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QModelIndex>::growAppend
                ((QCommonArrayOps<QModelIndex> *)this,pQVar5,pQVar5 + lVar3);
    }
    else {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                (&this->d,GrowsAtEnd,lVar3,(QModelIndex **)0x0,(QArrayDataPointer<QModelIndex> *)0x0
                );
      lVar3 = (l->d).size;
      if ((lVar3 != 0) && (0 < lVar3)) {
        pQVar9 = (l->d).ptr;
        pQVar5 = pQVar9 + lVar3;
        pQVar6 = (this->d).ptr;
        do {
          lVar3 = (this->d).size;
          pQVar6[lVar3].m.ptr = (pQVar9->m).ptr;
          iVar8 = pQVar9->c;
          qVar7 = pQVar9->i;
          pQVar2 = pQVar6 + lVar3;
          pQVar2->r = pQVar9->r;
          pQVar2->c = iVar8;
          pQVar2->i = qVar7;
          pQVar9 = pQVar9 + 1;
          pqVar1 = &(this->d).size;
          *pqVar1 = *pqVar1 + 1;
        } while (pQVar9 < pQVar5);
      }
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }